

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2Bug21371806(void)

{
  RE2 re;
  Options local_280;
  RE2 local_268;
  LogMessage local_188;
  
  local_280.posix_syntax_ = false;
  local_280.longest_match_ = false;
  local_280.log_errors_ = true;
  local_280.max_mem_ = 0x800000;
  local_280.literal_ = false;
  local_280.never_nl_ = false;
  local_280.dot_nl_ = false;
  local_280.never_capture_ = false;
  local_280.case_sensitive_ = true;
  local_280.perl_classes_ = false;
  local_280.word_boundary_ = false;
  local_280.one_line_ = false;
  local_280.encoding_ = EncodingLatin1;
  local_188._0_8_ = "g\\p{Zl}]";
  local_188._8_4_ = 8;
  RE2::RE2(&local_268,(StringPiece *)&local_188,&local_280);
  if (local_268.error_code_ != NoError) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x628,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_188 + 8),"Check failed: re.ok()",0x15);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  RE2::~RE2(&local_268);
  return;
}

Assistant:

TEST(RE2, Bug21371806) {
  // Bug in parser accepting Unicode groups in Latin-1 mode,
  // causing compiler to fail in DCHECK in prog.cc.

  RE2::Options opt;
  opt.set_encoding(RE2::Options::EncodingLatin1);

  RE2 re("g\\p{Zl}]", opt);
  CHECK(re.ok());
}